

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendAlign.h
# Opt level: O0

int __thiscall
ExtendAlign<DNA>::Extend
          (ExtendAlign<DNA> *this,Sequence<DNA> *A,Sequence<DNA> *B,size_t *bestA,size_t *bestB,
          Cigar *cigar,AlignmentDirection dir,size_t startA,size_t startB)

{
  value_type vVar1;
  char cVar2;
  char cVar3;
  int8_t iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  size_type sVar8;
  ulong uVar9;
  long lVar10;
  reference pvVar11;
  reference pvVar12;
  int *piVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  value_type local_171;
  value_type local_129;
  CigarOp op_1;
  CigarEntry ce;
  size_t by;
  size_t bx;
  int local_108;
  int local_104;
  value_type local_fe;
  byte local_fd;
  int local_fc;
  CigarOp op;
  bool match;
  ulong uStack_f8;
  int colGap;
  size_t lastX;
  int local_e8;
  int diagScore;
  int score_1;
  int rowGap;
  size_t firstX;
  size_t rowSize;
  int bestScore;
  allocator<ExtendAlign<DNA>::Cell> local_99;
  vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_> local_98;
  ulong local_80;
  size_t height;
  size_t width;
  size_t bestY;
  size_t bestX;
  size_t bIdx;
  size_t aIdx;
  size_t y;
  size_t x;
  Cigar *pCStack_38;
  int score;
  Cigar *cigar_local;
  size_t *bestB_local;
  size_t *bestA_local;
  Sequence<DNA> *B_local;
  Sequence<DNA> *A_local;
  ExtendAlign<DNA> *this_local;
  
  pCStack_38 = cigar;
  cigar_local = (Cigar *)bestB;
  bestB_local = bestA;
  bestA_local = (size_t *)B;
  B_local = A;
  A_local = (Sequence<DNA> *)this;
  if (dir == Forward) {
    sVar7 = Sequence<DNA>::Length(A);
    height = (sVar7 - startA) + 1;
    sVar7 = Sequence<DNA>::Length((Sequence<DNA> *)bestA_local);
    local_80 = (sVar7 - startB) + 1;
  }
  else {
    height = startA + 1;
    local_80 = startB + 1;
  }
  sVar8 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::capacity
                    (&this->mRow);
  if (sVar8 < height) {
    auVar15._8_4_ = (int)(height >> 0x20);
    auVar15._0_8_ = height;
    auVar15._12_4_ = 0x45300000;
    dVar14 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)height) - 4503599627370496.0)) * 1.5;
    uVar9 = (ulong)dVar14;
    std::allocator<ExtendAlign<DNA>::Cell>::allocator(&local_99);
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::vector
              (&local_98,uVar9 | (long)(dVar14 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f,
               &local_99);
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::operator=
              (&this->mRow,&local_98);
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::~vector(&local_98)
    ;
    std::allocator<ExtendAlign<DNA>::Cell>::~allocator(&local_99);
  }
  sVar8 = std::vector<CigarOp,_std::allocator<CigarOp>_>::capacity(&this->mOperations);
  if (sVar8 < height * local_80) {
    lVar10 = height * local_80;
    auVar16._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = 0x45300000;
    dVar14 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * 1.5;
    uVar9 = (ulong)dVar14;
    std::allocator<CigarOp>::allocator((allocator<CigarOp> *)((long)&rowSize + 7));
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              ((vector<CigarOp,_std::allocator<CigarOp>_> *)&bestScore,
               uVar9 | (long)(dVar14 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f,
               (allocator<CigarOp> *)((long)&rowSize + 7));
    std::vector<CigarOp,_std::allocator<CigarOp>_>::operator=
              (&this->mOperations,(vector<CigarOp,_std::allocator<CigarOp>_> *)&bestScore);
    std::vector<CigarOp,_std::allocator<CigarOp>_>::~vector
              ((vector<CigarOp,_std::allocator<CigarOp>_> *)&bestScore);
    std::allocator<CigarOp>::~allocator((allocator<CigarOp> *)((long)&rowSize + 7));
  }
  bestY = 0;
  width = 0;
  if (bestB_local != (size_t *)0x0) {
    *bestB_local = startA;
  }
  if (cigar_local != (Cigar *)0x0) {
    (cigar_local->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data._M_map
         = (_Map_pointer)startB;
  }
  rowSize._0_4_ = 0;
  pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::operator[]
                      (&this->mRow,0);
  pvVar11->score = 0;
  iVar5 = (this->mAP).gapOpenScore;
  iVar6 = (this->mAP).gapExtendScore;
  pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::operator[]
                      (&this->mRow,0);
  pvVar11->scoreGap = iVar5 + iVar6;
  y = 1;
  while ((y < height &&
         (x._4_4_ = (this->mAP).gapOpenScore + (int)y * (this->mAP).gapExtendScore,
         iVar5 = (this->mAP).xDrop, SBORROW4(x._4_4_,-iVar5) == x._4_4_ + iVar5 < 0))) {
    pvVar12 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[](&this->mOperations,y);
    iVar5 = x._4_4_;
    *pvVar12 = Insertion;
    pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
              operator[](&this->mRow,y);
    pvVar11->score = iVar5;
    iVar5 = MinInt();
    pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
              operator[](&this->mRow,y);
    pvVar11->scoreGap = iVar5;
    y = y + 1;
  }
  firstX = y;
  _score_1 = 0;
  for (aIdx = 1; aIdx < local_80; aIdx = aIdx + 1) {
    diagScore = MinInt();
    local_e8 = MinInt();
    lastX._4_4_ = MinInt();
    uStack_f8 = _score_1;
    for (y = _score_1; y < firstX; y = y + 1) {
      pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                operator[](&this->mRow,y);
      local_fc = pvVar11->scoreGap;
      bIdx = 0;
      bestX = 0;
      if (y != 0) {
        if (dir == Forward) {
          bIdx = (startA + y) - 1;
          bestX = (startB + aIdx) - 1;
        }
        else {
          bIdx = startA - y;
          bestX = startB - aIdx;
        }
        cVar2 = Sequence<DNA>::operator[](B_local,bIdx);
        cVar3 = Sequence<DNA>::operator[]((Sequence<DNA> *)bestA_local,bestX);
        local_fd = MatchPolicy<DNA>::Match(cVar2,cVar3);
        iVar5 = lastX._4_4_;
        cVar2 = Sequence<DNA>::operator[](B_local,bIdx);
        cVar3 = Sequence<DNA>::operator[]((Sequence<DNA> *)bestA_local,bestX);
        iVar4 = ScorePolicy<DNA>::Score(cVar2,cVar3);
        local_e8 = iVar5 + iVar4;
      }
      if (local_e8 < diagScore) {
        local_e8 = diagScore;
      }
      if (local_e8 < local_fc) {
        local_e8 = local_fc;
      }
      pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                operator[](&this->mRow,y);
      lastX._4_4_ = pvVar11->score;
      if ((this->mAP).xDrop < (int)rowSize - local_e8) {
        iVar5 = MinInt();
        pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                  operator[](&this->mRow,y);
        pvVar11->score = iVar5;
        if (y == _score_1) {
          _score_1 = _score_1 + 1;
        }
      }
      else {
        uStack_f8 = y;
        if ((int)rowSize < local_e8) {
          rowSize._0_4_ = local_e8;
          if (bestB_local != (size_t *)0x0) {
            *bestB_local = bIdx;
          }
          if (cigar_local != (Cigar *)0x0) {
            (cigar_local->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
            super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
            super__Deque_impl_data._M_map = (_Map_pointer)bestX;
          }
          bestY = y;
          width = aIdx;
        }
        if (local_e8 == diagScore) {
          local_fe = Insertion;
        }
        else if (local_e8 == local_fc) {
          local_fe = Deletion;
        }
        else {
          local_171 = Match;
          if ((local_fd & 1) == 0) {
            local_171 = Mismatch;
          }
          local_fe = local_171;
        }
        vVar1 = local_fe;
        pvVar12 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[]
                            (&this->mOperations,aIdx * height + y);
        iVar5 = local_e8;
        *pvVar12 = vVar1;
        pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                  operator[](&this->mRow,y);
        pvVar11->score = iVar5;
        local_104 = local_e8 + (this->mAP).gapOpenScore + (this->mAP).gapExtendScore;
        local_108 = local_fc + (this->mAP).gapExtendScore;
        piVar13 = std::max<int>(&local_104,&local_108);
        iVar5 = *piVar13;
        pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                  operator[](&this->mRow,y);
        pvVar11->scoreGap = iVar5;
        bx._4_4_ = local_e8 + (this->mAP).gapOpenScore + (this->mAP).gapExtendScore;
        bx._0_4_ = diagScore + (this->mAP).gapExtendScore;
        piVar13 = std::max<int>((int *)((long)&bx + 4),(int *)&bx);
        diagScore = *piVar13;
      }
    }
    if (_score_1 == firstX) break;
    if (uStack_f8 < firstX - 1) {
      firstX = uStack_f8 + 1;
    }
    else {
      for (; iVar5 = diagScore, (int)rowSize - (this->mAP).xDrop <= diagScore && firstX < height;
          diagScore = (this->mAP).gapExtendScore + diagScore) {
        pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                  operator[](&this->mRow,firstX);
        pvVar11->score = iVar5;
        iVar6 = diagScore + (this->mAP).gapOpenScore;
        iVar5 = (this->mAP).gapExtendScore;
        pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                  operator[](&this->mRow,firstX);
        pvVar11->scoreGap = iVar6 + iVar5;
        pvVar12 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[]
                            (&this->mOperations,aIdx * height + firstX);
        *pvVar12 = Insertion;
        firstX = firstX + 1;
      }
    }
    if (firstX < height) {
      iVar5 = MinInt();
      pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                operator[](&this->mRow,firstX);
      pvVar11->score = iVar5;
      iVar5 = MinInt();
      pvVar11 = std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
                operator[](&this->mRow,firstX);
      pvVar11->scoreGap = iVar5;
      firstX = firstX + 1;
    }
  }
  if (pCStack_38 != (Cigar *)0x0) {
    by = bestY;
    ce.count = (undefined4)width;
    ce.op = width._4_1_;
    ce._5_3_ = width._5_3_;
    CigarEntry::CigarEntry((CigarEntry *)&stack0xfffffffffffffed8);
    Cigar::Clear(pCStack_38);
    while (by != 0 || ce != (CigarEntry)0x0) {
      pvVar12 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[]
                          (&this->mOperations,(long)ce * height + by);
      local_129 = *pvVar12;
      Cigar::Add(pCStack_38,&local_129);
      switch(local_129) {
      case Match:
        by = by - 1;
        ce = (CigarEntry)((long)ce + -1);
        break;
      default:
        break;
      case Deletion:
        ce = (CigarEntry)((long)ce + -1);
        break;
      case Insertion:
        by = by - 1;
        break;
      case Mismatch:
        by = by - 1;
        ce = (CigarEntry)((long)ce + -1);
      }
    }
    if (dir == Forward) {
      Cigar::Reverse(pCStack_38);
    }
  }
  return (int)rowSize;
}

Assistant:

int Extend( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
              size_t* bestA = NULL, size_t* bestB = NULL, Cigar* cigar = NULL,
              const AlignmentDirection dir = AlignmentDirection::Forward,
              size_t startA = 0, size_t startB = 0 ) {
    int    score;
    size_t x, y;
    size_t aIdx, bIdx;
    size_t bestX, bestY;

    size_t width, height;

    if( dir == AlignmentDirection::Forward ) {
      width  = A.Length() - startA + 1;
      height = B.Length() - startB + 1;
    } else {
      width  = startA + 1;
      height = startB + 1;
    }

    if( mRow.capacity() < width ) {
      // Enlarge vector
      mRow = Cells( width * 1.5 );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    bestX = 0;
    bestY = 0;

    if( bestA )
      *bestA = startA;
    if( bestB )
      *bestB = startB;

    int bestScore      = 0;
    mRow[ 0 ].score    = 0;
    mRow[ 0 ].scoreGap = mAP.gapOpenScore + mAP.gapExtendScore;

    for( x = 1; x < width; x++ ) {
      score = mAP.gapOpenScore + x * mAP.gapExtendScore;

      if( score < -mAP.xDrop )
        break;

      mOperations[ x ]   = CigarOp::Insertion;
      mRow[ x ].score    = score;
      mRow[ x ].scoreGap = MinInt();
    }
    size_t rowSize = x;
    /* Print( mRow ); */

    size_t firstX = 0;

    for( y = 1; y < height; y++ ) {

      int rowGap    = MinInt();
      int score     = MinInt();
      int diagScore = MinInt();

      size_t lastX = firstX;

      for( x = firstX; x < rowSize; x++ ) {
        int colGap = mRow[ x ].scoreGap;

        aIdx = 0;
        bIdx = 0;
        bool match;
        if( x > 0 ) {
          // diagScore: score at col-1, row-1

          if( dir == AlignmentDirection::Forward ) {
            aIdx = startA + x - 1;
            bIdx = startB + y - 1;
          } else {
            aIdx = startA - x;
            bIdx = startB - y;
          }

          /* printf( "x:%zu y:%zu %c == %c\n", x, y, A[ aIdx ], B[ bIdx ] ); */
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < rowGap )
          score = rowGap;
        if( score < colGap )
          score = colGap;

        // mRow[ x ] right now points to the previous row, so use this
        // in the next iteration for the diagonal computation of (x, y )
        diagScore = mRow[ x ].score;

        if( bestScore - score > mAP.xDrop ) {
          // X-Drop test failed
          mRow[ x ].score = MinInt();

          if( x == firstX ) {
            // Tighten left bound
            firstX++;
          }
        } else {
          lastX = x;

          // Check if we achieved new highscore
          if( score > bestScore ) {
            bestScore = score;

            if( bestA )
              *bestA = aIdx;
            if( bestB )
              *bestB = bIdx;

            bestX = x;
            bestY = y;
          }

          // Record new score
          CigarOp op;
          if( score == rowGap ) {
            op = CigarOp::Insertion;
          } else if( score == colGap ) {
            op = CigarOp::Deletion;
          } else {
            op = match ? CigarOp::Match : CigarOp::Mismatch;
          }
          mOperations[ y * width + x ] = op;

          mRow[ x ].score = score;
          mRow[ x ].scoreGap =
            std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                      colGap + mAP.gapExtendScore );
          rowGap = std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                             rowGap + mAP.gapExtendScore );
        }
      }

      if( firstX == rowSize ) {
        // All cells failed the X-Drop test
        // We are done 8)
        break;
      }

      if( lastX < rowSize - 1 ) {
        // Tighten right bound
        rowSize = lastX + 1;
      } else {
        // Extend row, since last checked column didn't fail X-Drop test
        while( rowGap >= ( bestScore - mAP.xDrop ) && rowSize < width ) {
          mRow[ rowSize ].score = rowGap;
          mRow[ rowSize ].scoreGap =
            rowGap + mAP.gapOpenScore + mAP.gapExtendScore;
          mOperations[ y * width + rowSize ] = CigarOp::Insertion;
          rowGap += mAP.gapExtendScore;
          rowSize++;
        }
      }

      // Properly reset right bound
      if( rowSize < width ) {
        mRow[ rowSize ].score    = MinInt();
        mRow[ rowSize ].scoreGap = MinInt();
        rowSize++;
      }
      /* Print( mRow ); */
    }

    if( cigar ) {
      size_t bx = bestX;
      size_t by = bestY;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      if( dir == AlignmentDirection::Forward ) {
        cigar->Reverse();
      }
    }

    return bestScore;
  }